

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O3

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::TableSlotManager::addSlot
          (TableSlotManager *this,Name func,Slot slot)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  IString local_60;
  _Base_ptr local_50;
  _Base_ptr p_Stack_48;
  size_t local_40;
  _Base_ptr p_Stack_38;
  _Base_ptr local_30;
  
  local_60.str._M_str = func.super_IString.str._M_str;
  local_60.str._M_len = func.super_IString.str._M_len;
  local_30 = (_Base_ptr)slot._32_8_;
  local_40 = slot.global.super_IString.str._M_len;
  p_Stack_38 = (_Base_ptr)slot.global.super_IString.str._M_str;
  local_50 = (_Base_ptr)slot.tableName.super_IString.str._M_len;
  p_Stack_48 = (_Base_ptr)slot.tableName.super_IString.str._M_str;
  p_Var1 = &(this->funcIndices)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->funcIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var1->_M_header;
  if (p_Var3 == (_Base_ptr)0x0) {
LAB_0074dd84:
    if (p_Var7 == (this->funcIndices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
    goto LAB_0074dda6;
    p_Var5 = (_Base_ptr)std::_Rb_tree_decrement(p_Var7);
  }
  else {
    do {
      p_Var5 = p_Var3;
      bVar4 = IString::operator<(&local_60,(IString *)(p_Var5 + 1));
      p_Var3 = (&p_Var5->_M_left)[!bVar4];
    } while ((&p_Var5->_M_left)[!bVar4] != (_Base_ptr)0x0);
    p_Var7 = p_Var5;
    if (bVar4) goto LAB_0074dd84;
  }
  bVar4 = IString::operator<((IString *)(p_Var5 + 1),&local_60);
  if (!bVar4) {
    return;
  }
LAB_0074dda6:
  if (p_Var1 == (_Rb_tree_header *)p_Var7) {
    bVar4 = true;
  }
  else {
    bVar4 = IString::operator<(&local_60,(IString *)(p_Var7 + 1));
  }
  p_Var6 = (_Rb_tree_node_base *)operator_new(0x58);
  *(size_t *)(p_Var6 + 1) = local_60.str._M_len;
  p_Var6[1]._M_parent = (_Base_ptr)local_60.str._M_str;
  p_Var6[1]._M_left = local_50;
  p_Var6[1]._M_right = p_Stack_48;
  *(size_t *)(p_Var6 + 2) = local_40;
  p_Var6[2]._M_parent = p_Stack_38;
  p_Var6[2]._M_left = local_30;
  std::_Rb_tree_insert_and_rebalance(bVar4,p_Var6,p_Var7,&p_Var1->_M_header);
  psVar2 = &(this->funcIndices)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void TableSlotManager::addSlot(Name func, Slot slot) {
  // Ignore functions that already have slots.
  funcIndices.insert({func, slot});
}